

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O2

uint16_t unorm_getFCD16_63(UChar32 c)

{
  uint16_t uVar1;
  uint in_EAX;
  Normalizer2Impl *this;
  UErrorCode errorCode;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this = icu_63::Normalizer2Factory::getNFCImpl((UErrorCode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ < 1) {
    uVar1 = icu_63::Normalizer2Impl::getFCD16(this,c);
  }
  else {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

U_CFUNC uint16_t
unorm_getFCD16(UChar32 c) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
    if(U_SUCCESS(errorCode)) {
        return impl->getFCD16(c);
    } else {
        return 0;
    }
}